

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitter::setCollapsible(QSplitter *this,int index,bool collapse)

{
  QSplitterPrivate *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  byte in_DL;
  uint in_ESI;
  long in_FS_OFFSET;
  byte bVar3;
  QSplitterPrivate *d;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QList<QSplitterLayoutStruct_*> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  bool bVar4;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSplitter *)0x69c791);
  bVar4 = true;
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffffb0 = (QList<QSplitterLayoutStruct_*> *)(long)(int)in_ESI;
    qVar1 = QList<QSplitterLayoutStruct_*>::size(&this_00->list);
    bVar4 = qVar1 <= (long)in_stack_ffffffffffffffb0;
  }
  if (bVar4 == false) {
    bVar3 = (in_DL & 1) != 0;
    ppQVar2 = QList<QSplitterLayoutStruct_*>::at
                        (in_stack_ffffffffffffffb0,(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffa8))
    ;
    (*ppQVar2)->field_0x14 = (*ppQVar2)->field_0x14 & 0xf9 | (bVar3 & 3) << 1;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT17(bVar4,in_stack_ffffffffffffffb8),
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QMessageLogger::warning
              (local_28,"QSplitter::setCollapsible: Index %d out of range",(ulong)in_ESI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitter::setCollapsible(int index, bool collapse)
{
    Q_D(QSplitter);

    if (Q_UNLIKELY(index < 0 || index >= d->list.size())) {
        qWarning("QSplitter::setCollapsible: Index %d out of range", index);
        return;
    }
    d->list.at(index)->collapsible = collapse ? 1 : 0;
}